

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O0

void growstrtab(lua_State *L,stringtable *tb)

{
  stringtable *tb_local;
  lua_State *L_local;
  
  if ((tb->nuse == 0x7fffffff) && (luaC_fullgc(L,1), tb->nuse == 0x7fffffff)) {
    luaD_throw(L,'\x04');
  }
  if (tb->size < 0x40000000) {
    luaS_resize(L,tb->size << 1);
  }
  return;
}

Assistant:

static void growstrtab (lua_State *L, stringtable *tb) {
  if (l_unlikely(tb->nuse == INT_MAX)) {  /* too many strings? */
    luaC_fullgc(L, 1);  /* try to free some... */
    if (tb->nuse == INT_MAX)  /* still too many? */
      luaM_error(L);  /* cannot even create a message... */
  }
  if (tb->size <= MAXSTRTB / 2)  /* can grow string table? */
    luaS_resize(L, tb->size * 2);
}